

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

bool __thiscall CommandLineArguments::parse(CommandLineArguments *this,TestPlugin *plugin)

{
  bool bVar1;
  long *in_RSI;
  long in_RDI;
  SimpleString argument;
  int i;
  bool correctParameters;
  SimpleString *in_stack_fffffffffffffef8;
  undefined2 in_stack_ffffffffffffff00;
  byte in_stack_ffffffffffffff02;
  byte in_stack_ffffffffffffff03;
  byte in_stack_ffffffffffffff04;
  undefined1 in_stack_ffffffffffffff05;
  byte in_stack_ffffffffffffff06;
  byte in_stack_ffffffffffffff07;
  byte in_stack_ffffffffffffff08;
  byte in_stack_ffffffffffffff09;
  byte in_stack_ffffffffffffff0a;
  byte in_stack_ffffffffffffff0b;
  byte in_stack_ffffffffffffff0c;
  byte in_stack_ffffffffffffff0d;
  byte in_stack_ffffffffffffff0e;
  byte in_stack_ffffffffffffff0f;
  int *in_stack_ffffffffffffff28;
  char **in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  CommandLineArguments *in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff48;
  char **in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  CommandLineArguments *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff70;
  char **in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  CommandLineArguments *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  char **in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  CommandLineArguments *in_stack_ffffffffffffffc0;
  int local_20;
  bool local_19;
  byte local_1;
  
  local_19 = true;
  for (local_20 = 1; local_20 < *(int *)(in_RDI + 8); local_20 = local_20 + 1) {
    SimpleString::SimpleString
              ((SimpleString *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,
                                 CONCAT15(in_stack_ffffffffffffff05,
                                          CONCAT14(in_stack_ffffffffffffff04,
                                                   CONCAT13(in_stack_ffffffffffffff03,
                                                            CONCAT12(in_stack_ffffffffffffff02,
                                                                     in_stack_ffffffffffffff00))))))
               ,(char *)in_stack_fffffffffffffef8);
    SimpleString::SimpleString
              ((SimpleString *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,
                                 CONCAT15(in_stack_ffffffffffffff05,
                                          CONCAT14(in_stack_ffffffffffffff04,
                                                   CONCAT13(in_stack_ffffffffffffff03,
                                                            CONCAT12(in_stack_ffffffffffffff02,
                                                                     in_stack_ffffffffffffff00))))))
               ,(char *)in_stack_fffffffffffffef8);
    bVar1 = operator==((SimpleString *)
                       CONCAT17(in_stack_ffffffffffffff07,
                                CONCAT16(in_stack_ffffffffffffff06,
                                         CONCAT15(in_stack_ffffffffffffff05,
                                                  CONCAT14(in_stack_ffffffffffffff04,
                                                           CONCAT13(in_stack_ffffffffffffff03,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))),
                       in_stack_fffffffffffffef8);
    SimpleString::~SimpleString((SimpleString *)0x21baac);
    if (bVar1) {
      *(undefined1 *)(in_RDI + 0x18) = 1;
    }
    else {
      SimpleString::SimpleString
                ((SimpleString *)
                 CONCAT17(in_stack_ffffffffffffff07,
                          CONCAT16(in_stack_ffffffffffffff06,
                                   CONCAT15(in_stack_ffffffffffffff05,
                                            CONCAT14(in_stack_ffffffffffffff04,
                                                     CONCAT13(in_stack_ffffffffffffff03,
                                                              CONCAT12(in_stack_ffffffffffffff02,
                                                                       in_stack_ffffffffffffff00))))
                                  )),(char *)in_stack_fffffffffffffef8);
      bVar1 = operator==((SimpleString *)
                         CONCAT17(in_stack_ffffffffffffff07,
                                  CONCAT16(in_stack_ffffffffffffff06,
                                           CONCAT15(in_stack_ffffffffffffff05,
                                                    CONCAT14(in_stack_ffffffffffffff04,
                                                             CONCAT13(in_stack_ffffffffffffff03,
                                                                      CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))),
                         in_stack_fffffffffffffef8);
      SimpleString::~SimpleString((SimpleString *)0x21bb41);
      if (bVar1) {
        *(undefined1 *)(in_RDI + 0x19) = 1;
      }
      else {
        SimpleString::SimpleString
                  ((SimpleString *)
                   CONCAT17(in_stack_ffffffffffffff07,
                            CONCAT16(in_stack_ffffffffffffff06,
                                     CONCAT15(in_stack_ffffffffffffff05,
                                              CONCAT14(in_stack_ffffffffffffff04,
                                                       CONCAT13(in_stack_ffffffffffffff03,
                                                                CONCAT12(in_stack_ffffffffffffff02,
                                                                         in_stack_ffffffffffffff00))
                                                      )))),(char *)in_stack_fffffffffffffef8);
        bVar1 = operator==((SimpleString *)
                           CONCAT17(in_stack_ffffffffffffff07,
                                    CONCAT16(in_stack_ffffffffffffff06,
                                             CONCAT15(in_stack_ffffffffffffff05,
                                                      CONCAT14(in_stack_ffffffffffffff04,
                                                               CONCAT13(in_stack_ffffffffffffff03,
                                                                        CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))),
                           in_stack_fffffffffffffef8);
        SimpleString::~SimpleString((SimpleString *)0x21bbbd);
        if (bVar1) {
          *(undefined1 *)(in_RDI + 0x1a) = 1;
        }
        else {
          SimpleString::SimpleString
                    ((SimpleString *)
                     CONCAT17(in_stack_ffffffffffffff07,
                              CONCAT16(in_stack_ffffffffffffff06,
                                       CONCAT15(in_stack_ffffffffffffff05,
                                                CONCAT14(in_stack_ffffffffffffff04,
                                                         CONCAT13(in_stack_ffffffffffffff03,
                                                                  CONCAT12(in_stack_ffffffffffffff02
                                                                           ,
                                                  in_stack_ffffffffffffff00)))))),
                     (char *)in_stack_fffffffffffffef8);
          bVar1 = operator==((SimpleString *)
                             CONCAT17(in_stack_ffffffffffffff07,
                                      CONCAT16(in_stack_ffffffffffffff06,
                                               CONCAT15(in_stack_ffffffffffffff05,
                                                        CONCAT14(in_stack_ffffffffffffff04,
                                                                 CONCAT13(in_stack_ffffffffffffff03,
                                                                          CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))),
                             in_stack_fffffffffffffef8);
          SimpleString::~SimpleString((SimpleString *)0x21bc39);
          if (bVar1) {
            *(undefined1 *)(in_RDI + 0x1b) = 1;
          }
          else {
            SimpleString::SimpleString
                      ((SimpleString *)
                       CONCAT17(in_stack_ffffffffffffff07,
                                CONCAT16(in_stack_ffffffffffffff06,
                                         CONCAT15(in_stack_ffffffffffffff05,
                                                  CONCAT14(in_stack_ffffffffffffff04,
                                                           CONCAT13(in_stack_ffffffffffffff03,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))),
                       (char *)in_stack_fffffffffffffef8);
            bVar1 = operator==((SimpleString *)
                               CONCAT17(in_stack_ffffffffffffff07,
                                        CONCAT16(in_stack_ffffffffffffff06,
                                                 CONCAT15(in_stack_ffffffffffffff05,
                                                          CONCAT14(in_stack_ffffffffffffff04,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffff03,
                                                  CONCAT12(in_stack_ffffffffffffff02,
                                                           in_stack_ffffffffffffff00)))))),
                               in_stack_fffffffffffffef8);
            SimpleString::~SimpleString((SimpleString *)0x21bcb5);
            if (bVar1) {
              *(undefined1 *)(in_RDI + 0x1c) = 1;
            }
            else {
              SimpleString::SimpleString
                        ((SimpleString *)
                         CONCAT17(in_stack_ffffffffffffff07,
                                  CONCAT16(in_stack_ffffffffffffff06,
                                           CONCAT15(in_stack_ffffffffffffff05,
                                                    CONCAT14(in_stack_ffffffffffffff04,
                                                             CONCAT13(in_stack_ffffffffffffff03,
                                                                      CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))),
                         (char *)in_stack_fffffffffffffef8);
              bVar1 = operator==((SimpleString *)
                                 CONCAT17(in_stack_ffffffffffffff07,
                                          CONCAT16(in_stack_ffffffffffffff06,
                                                   CONCAT15(in_stack_ffffffffffffff05,
                                                            CONCAT14(in_stack_ffffffffffffff04,
                                                                     CONCAT13(
                                                  in_stack_ffffffffffffff03,
                                                  CONCAT12(in_stack_ffffffffffffff02,
                                                           in_stack_ffffffffffffff00)))))),
                                 in_stack_fffffffffffffef8);
              SimpleString::~SimpleString((SimpleString *)0x21bd31);
              if (bVar1) {
                *(undefined1 *)(in_RDI + 0x1d) = 1;
              }
              else {
                SimpleString::SimpleString
                          ((SimpleString *)
                           CONCAT17(in_stack_ffffffffffffff07,
                                    CONCAT16(in_stack_ffffffffffffff06,
                                             CONCAT15(in_stack_ffffffffffffff05,
                                                      CONCAT14(in_stack_ffffffffffffff04,
                                                               CONCAT13(in_stack_ffffffffffffff03,
                                                                        CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))),
                           (char *)in_stack_fffffffffffffef8);
                bVar1 = SimpleString::startsWith
                                  ((SimpleString *)
                                   CONCAT17(in_stack_ffffffffffffff0f,
                                            CONCAT16(in_stack_ffffffffffffff0e,
                                                     CONCAT15(in_stack_ffffffffffffff0d,
                                                              CONCAT14(in_stack_ffffffffffffff0c,
                                                                       CONCAT13(
                                                  in_stack_ffffffffffffff0b,
                                                  CONCAT12(in_stack_ffffffffffffff0a,
                                                           CONCAT11(in_stack_ffffffffffffff09,
                                                                    in_stack_ffffffffffffff08)))))))
                                   ,(SimpleString *)
                                    CONCAT17(in_stack_ffffffffffffff07,
                                             CONCAT16(in_stack_ffffffffffffff06,
                                                      CONCAT15(in_stack_ffffffffffffff05,
                                                               CONCAT14(in_stack_ffffffffffffff04,
                                                                        CONCAT13(
                                                  in_stack_ffffffffffffff03,
                                                  CONCAT12(in_stack_ffffffffffffff02,
                                                           in_stack_ffffffffffffff00)))))));
                SimpleString::~SimpleString((SimpleString *)0x21bdad);
                if (bVar1) {
                  SetRepeatCount(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
                }
                else {
                  SimpleString::SimpleString
                            ((SimpleString *)
                             CONCAT17(in_stack_ffffffffffffff07,
                                      CONCAT16(in_stack_ffffffffffffff06,
                                               CONCAT15(in_stack_ffffffffffffff05,
                                                        CONCAT14(in_stack_ffffffffffffff04,
                                                                 CONCAT13(in_stack_ffffffffffffff03,
                                                                          CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))),
                             (char *)in_stack_fffffffffffffef8);
                  bVar1 = SimpleString::startsWith
                                    ((SimpleString *)
                                     CONCAT17(in_stack_ffffffffffffff0f,
                                              CONCAT16(in_stack_ffffffffffffff0e,
                                                       CONCAT15(in_stack_ffffffffffffff0d,
                                                                CONCAT14(in_stack_ffffffffffffff0c,
                                                                         CONCAT13(
                                                  in_stack_ffffffffffffff0b,
                                                  CONCAT12(in_stack_ffffffffffffff0a,
                                                           CONCAT11(in_stack_ffffffffffffff09,
                                                                    in_stack_ffffffffffffff08)))))))
                                     ,(SimpleString *)
                                      CONCAT17(in_stack_ffffffffffffff07,
                                               CONCAT16(in_stack_ffffffffffffff06,
                                                        CONCAT15(in_stack_ffffffffffffff05,
                                                                 CONCAT14(in_stack_ffffffffffffff04,
                                                                          CONCAT13(
                                                  in_stack_ffffffffffffff03,
                                                  CONCAT12(in_stack_ffffffffffffff02,
                                                           in_stack_ffffffffffffff00)))))));
                  SimpleString::~SimpleString((SimpleString *)0x21be3b);
                  if (bVar1) {
                    AddGroupFilter(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                                   in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
                  }
                  else {
                    SimpleString::SimpleString
                              ((SimpleString *)
                               CONCAT17(in_stack_ffffffffffffff07,
                                        CONCAT16(in_stack_ffffffffffffff06,
                                                 CONCAT15(in_stack_ffffffffffffff05,
                                                          CONCAT14(in_stack_ffffffffffffff04,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffff03,
                                                  CONCAT12(in_stack_ffffffffffffff02,
                                                           in_stack_ffffffffffffff00)))))),
                               (char *)in_stack_fffffffffffffef8);
                    in_stack_ffffffffffffff0f =
                         SimpleString::startsWith
                                   ((SimpleString *)
                                    CONCAT17(in_stack_ffffffffffffff0f,
                                             CONCAT16(in_stack_ffffffffffffff0e,
                                                      CONCAT15(in_stack_ffffffffffffff0d,
                                                               CONCAT14(in_stack_ffffffffffffff0c,
                                                                        CONCAT13(
                                                  in_stack_ffffffffffffff0b,
                                                  CONCAT12(in_stack_ffffffffffffff0a,
                                                           CONCAT11(in_stack_ffffffffffffff09,
                                                                    in_stack_ffffffffffffff08)))))))
                                    ,(SimpleString *)
                                     CONCAT17(in_stack_ffffffffffffff07,
                                              CONCAT16(in_stack_ffffffffffffff06,
                                                       CONCAT15(in_stack_ffffffffffffff05,
                                                                CONCAT14(in_stack_ffffffffffffff04,
                                                                         CONCAT13(
                                                  in_stack_ffffffffffffff03,
                                                  CONCAT12(in_stack_ffffffffffffff02,
                                                           in_stack_ffffffffffffff00)))))));
                    SimpleString::~SimpleString((SimpleString *)0x21bec9);
                    if ((in_stack_ffffffffffffff0f & 1) == 0) {
                      SimpleString::SimpleString
                                ((SimpleString *)
                                 CONCAT17(in_stack_ffffffffffffff07,
                                          CONCAT16(in_stack_ffffffffffffff06,
                                                   CONCAT15(in_stack_ffffffffffffff05,
                                                            CONCAT14(in_stack_ffffffffffffff04,
                                                                     CONCAT13(
                                                  in_stack_ffffffffffffff03,
                                                  CONCAT12(in_stack_ffffffffffffff02,
                                                           in_stack_ffffffffffffff00)))))),
                                 (char *)in_stack_fffffffffffffef8);
                      in_stack_ffffffffffffff0e =
                           SimpleString::startsWith
                                     ((SimpleString *)
                                      CONCAT17(in_stack_ffffffffffffff0f,
                                               CONCAT16(in_stack_ffffffffffffff0e,
                                                        CONCAT15(in_stack_ffffffffffffff0d,
                                                                 CONCAT14(in_stack_ffffffffffffff0c,
                                                                          CONCAT13(
                                                  in_stack_ffffffffffffff0b,
                                                  CONCAT12(in_stack_ffffffffffffff0a,
                                                           CONCAT11(in_stack_ffffffffffffff09,
                                                                    in_stack_ffffffffffffff08)))))))
                                      ,(SimpleString *)
                                       CONCAT17(in_stack_ffffffffffffff07,
                                                CONCAT16(in_stack_ffffffffffffff06,
                                                         CONCAT15(in_stack_ffffffffffffff05,
                                                                  CONCAT14(in_stack_ffffffffffffff04
                                                                           ,CONCAT13(
                                                  in_stack_ffffffffffffff03,
                                                  CONCAT12(in_stack_ffffffffffffff02,
                                                           in_stack_ffffffffffffff00)))))));
                      SimpleString::~SimpleString((SimpleString *)0x21bf57);
                      if ((in_stack_ffffffffffffff0e & 1) == 0) {
                        SimpleString::SimpleString
                                  ((SimpleString *)
                                   CONCAT17(in_stack_ffffffffffffff07,
                                            CONCAT16(in_stack_ffffffffffffff06,
                                                     CONCAT15(in_stack_ffffffffffffff05,
                                                              CONCAT14(in_stack_ffffffffffffff04,
                                                                       CONCAT13(
                                                  in_stack_ffffffffffffff03,
                                                  CONCAT12(in_stack_ffffffffffffff02,
                                                           in_stack_ffffffffffffff00)))))),
                                   (char *)in_stack_fffffffffffffef8);
                        in_stack_ffffffffffffff0d =
                             SimpleString::startsWith
                                       ((SimpleString *)
                                        CONCAT17(in_stack_ffffffffffffff0f,
                                                 CONCAT16(in_stack_ffffffffffffff0e,
                                                          CONCAT15(in_stack_ffffffffffffff0d,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffff0c,
                                                  CONCAT13(in_stack_ffffffffffffff0b,
                                                           CONCAT12(in_stack_ffffffffffffff0a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff09,
                                                  in_stack_ffffffffffffff08))))))),
                                        (SimpleString *)
                                        CONCAT17(in_stack_ffffffffffffff07,
                                                 CONCAT16(in_stack_ffffffffffffff06,
                                                          CONCAT15(in_stack_ffffffffffffff05,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffff04,
                                                  CONCAT13(in_stack_ffffffffffffff03,
                                                           CONCAT12(in_stack_ffffffffffffff02,
                                                                    in_stack_ffffffffffffff00)))))))
                        ;
                        SimpleString::~SimpleString((SimpleString *)0x21bfdc);
                        if ((in_stack_ffffffffffffff0d & 1) == 0) {
                          SimpleString::SimpleString
                                    ((SimpleString *)
                                     CONCAT17(in_stack_ffffffffffffff07,
                                              CONCAT16(in_stack_ffffffffffffff06,
                                                       CONCAT15(in_stack_ffffffffffffff05,
                                                                CONCAT14(in_stack_ffffffffffffff04,
                                                                         CONCAT13(
                                                  in_stack_ffffffffffffff03,
                                                  CONCAT12(in_stack_ffffffffffffff02,
                                                           in_stack_ffffffffffffff00)))))),
                                     (char *)in_stack_fffffffffffffef8);
                          in_stack_ffffffffffffff0c =
                               SimpleString::startsWith
                                         ((SimpleString *)
                                          CONCAT17(in_stack_ffffffffffffff0f,
                                                   CONCAT16(in_stack_ffffffffffffff0e,
                                                            CONCAT15(in_stack_ffffffffffffff0d,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffff0c,
                                                  CONCAT13(in_stack_ffffffffffffff0b,
                                                           CONCAT12(in_stack_ffffffffffffff0a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff09,
                                                  in_stack_ffffffffffffff08))))))),
                                          (SimpleString *)
                                          CONCAT17(in_stack_ffffffffffffff07,
                                                   CONCAT16(in_stack_ffffffffffffff06,
                                                            CONCAT15(in_stack_ffffffffffffff05,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffff04,
                                                  CONCAT13(in_stack_ffffffffffffff03,
                                                           CONCAT12(in_stack_ffffffffffffff02,
                                                                    in_stack_ffffffffffffff00)))))))
                          ;
                          SimpleString::~SimpleString((SimpleString *)0x21c05e);
                          if ((in_stack_ffffffffffffff0c & 1) == 0) {
                            SimpleString::SimpleString
                                      ((SimpleString *)
                                       CONCAT17(in_stack_ffffffffffffff07,
                                                CONCAT16(in_stack_ffffffffffffff06,
                                                         CONCAT15(in_stack_ffffffffffffff05,
                                                                  CONCAT14(in_stack_ffffffffffffff04
                                                                           ,CONCAT13(
                                                  in_stack_ffffffffffffff03,
                                                  CONCAT12(in_stack_ffffffffffffff02,
                                                           in_stack_ffffffffffffff00)))))),
                                       (char *)in_stack_fffffffffffffef8);
                            in_stack_ffffffffffffff0b =
                                 SimpleString::startsWith
                                           ((SimpleString *)
                                            CONCAT17(in_stack_ffffffffffffff0f,
                                                     CONCAT16(in_stack_ffffffffffffff0e,
                                                              CONCAT15(in_stack_ffffffffffffff0d,
                                                                       CONCAT14(
                                                  in_stack_ffffffffffffff0c,
                                                  CONCAT13(in_stack_ffffffffffffff0b,
                                                           CONCAT12(in_stack_ffffffffffffff0a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff09,
                                                  in_stack_ffffffffffffff08))))))),
                                            (SimpleString *)
                                            CONCAT17(in_stack_ffffffffffffff07,
                                                     CONCAT16(in_stack_ffffffffffffff06,
                                                              CONCAT15(in_stack_ffffffffffffff05,
                                                                       CONCAT14(
                                                  in_stack_ffffffffffffff04,
                                                  CONCAT13(in_stack_ffffffffffffff03,
                                                           CONCAT12(in_stack_ffffffffffffff02,
                                                                    in_stack_ffffffffffffff00)))))))
                            ;
                            SimpleString::~SimpleString((SimpleString *)0x21c0e0);
                            if ((in_stack_ffffffffffffff0b & 1) == 0) {
                              SimpleString::SimpleString
                                        ((SimpleString *)
                                         CONCAT17(in_stack_ffffffffffffff07,
                                                  CONCAT16(in_stack_ffffffffffffff06,
                                                           CONCAT15(in_stack_ffffffffffffff05,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff04,
                                                  CONCAT13(in_stack_ffffffffffffff03,
                                                           CONCAT12(in_stack_ffffffffffffff02,
                                                                    in_stack_ffffffffffffff00)))))),
                                         (char *)in_stack_fffffffffffffef8);
                              in_stack_ffffffffffffff0a =
                                   SimpleString::startsWith
                                             ((SimpleString *)
                                              CONCAT17(in_stack_ffffffffffffff0f,
                                                       CONCAT16(in_stack_ffffffffffffff0e,
                                                                CONCAT15(in_stack_ffffffffffffff0d,
                                                                         CONCAT14(
                                                  in_stack_ffffffffffffff0c,
                                                  CONCAT13(in_stack_ffffffffffffff0b,
                                                           CONCAT12(in_stack_ffffffffffffff0a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff09,
                                                  in_stack_ffffffffffffff08))))))),
                                              (SimpleString *)
                                              CONCAT17(in_stack_ffffffffffffff07,
                                                       CONCAT16(in_stack_ffffffffffffff06,
                                                                CONCAT15(in_stack_ffffffffffffff05,
                                                                         CONCAT14(
                                                  in_stack_ffffffffffffff04,
                                                  CONCAT13(in_stack_ffffffffffffff03,
                                                           CONCAT12(in_stack_ffffffffffffff02,
                                                                    in_stack_ffffffffffffff00)))))))
                              ;
                              SimpleString::~SimpleString((SimpleString *)0x21c162);
                              if ((in_stack_ffffffffffffff0a & 1) == 0) {
                                SimpleString::SimpleString
                                          ((SimpleString *)
                                           CONCAT17(in_stack_ffffffffffffff07,
                                                    CONCAT16(in_stack_ffffffffffffff06,
                                                             CONCAT15(in_stack_ffffffffffffff05,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffff04,
                                                  CONCAT13(in_stack_ffffffffffffff03,
                                                           CONCAT12(in_stack_ffffffffffffff02,
                                                                    in_stack_ffffffffffffff00)))))),
                                           (char *)in_stack_fffffffffffffef8);
                                in_stack_ffffffffffffff09 =
                                     SimpleString::startsWith
                                               ((SimpleString *)
                                                CONCAT17(in_stack_ffffffffffffff0f,
                                                         CONCAT16(in_stack_ffffffffffffff0e,
                                                                  CONCAT15(in_stack_ffffffffffffff0d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff0c,
                                                  CONCAT13(in_stack_ffffffffffffff0b,
                                                           CONCAT12(in_stack_ffffffffffffff0a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff09,
                                                  in_stack_ffffffffffffff08))))))),
                                                (SimpleString *)
                                                CONCAT17(in_stack_ffffffffffffff07,
                                                         CONCAT16(in_stack_ffffffffffffff06,
                                                                  CONCAT15(in_stack_ffffffffffffff05
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff04,
                                                  CONCAT13(in_stack_ffffffffffffff03,
                                                           CONCAT12(in_stack_ffffffffffffff02,
                                                                    in_stack_ffffffffffffff00)))))))
                                ;
                                SimpleString::~SimpleString((SimpleString *)0x21c1e4);
                                if ((in_stack_ffffffffffffff09 & 1) == 0) {
                                  SimpleString::SimpleString
                                            ((SimpleString *)
                                             CONCAT17(in_stack_ffffffffffffff07,
                                                      CONCAT16(in_stack_ffffffffffffff06,
                                                               CONCAT15(in_stack_ffffffffffffff05,
                                                                        CONCAT14(
                                                  in_stack_ffffffffffffff04,
                                                  CONCAT13(in_stack_ffffffffffffff03,
                                                           CONCAT12(in_stack_ffffffffffffff02,
                                                                    in_stack_ffffffffffffff00)))))),
                                             (char *)in_stack_fffffffffffffef8);
                                  in_stack_ffffffffffffff08 =
                                       SimpleString::startsWith
                                                 ((SimpleString *)
                                                  CONCAT17(in_stack_ffffffffffffff0f,
                                                           CONCAT16(in_stack_ffffffffffffff0e,
                                                                    CONCAT15(
                                                  in_stack_ffffffffffffff0d,
                                                  CONCAT14(in_stack_ffffffffffffff0c,
                                                           CONCAT13(in_stack_ffffffffffffff0b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff0a,
                                                  CONCAT11(in_stack_ffffffffffffff09,
                                                           in_stack_ffffffffffffff08))))))),
                                                  (SimpleString *)
                                                  CONCAT17(in_stack_ffffffffffffff07,
                                                           CONCAT16(in_stack_ffffffffffffff06,
                                                                    CONCAT15(
                                                  in_stack_ffffffffffffff05,
                                                  CONCAT14(in_stack_ffffffffffffff04,
                                                           CONCAT13(in_stack_ffffffffffffff03,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))));
                                  SimpleString::~SimpleString((SimpleString *)0x21c266);
                                  if ((in_stack_ffffffffffffff08 & 1) == 0) {
                                    SimpleString::SimpleString
                                              ((SimpleString *)
                                               CONCAT17(in_stack_ffffffffffffff07,
                                                        CONCAT16(in_stack_ffffffffffffff06,
                                                                 CONCAT15(in_stack_ffffffffffffff05,
                                                                          CONCAT14(
                                                  in_stack_ffffffffffffff04,
                                                  CONCAT13(in_stack_ffffffffffffff03,
                                                           CONCAT12(in_stack_ffffffffffffff02,
                                                                    in_stack_ffffffffffffff00)))))),
                                               (char *)in_stack_fffffffffffffef8);
                                    in_stack_ffffffffffffff07 =
                                         SimpleString::startsWith
                                                   ((SimpleString *)
                                                    CONCAT17(in_stack_ffffffffffffff0f,
                                                             CONCAT16(in_stack_ffffffffffffff0e,
                                                                      CONCAT15(
                                                  in_stack_ffffffffffffff0d,
                                                  CONCAT14(in_stack_ffffffffffffff0c,
                                                           CONCAT13(in_stack_ffffffffffffff0b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff0a,
                                                  CONCAT11(in_stack_ffffffffffffff09,
                                                           in_stack_ffffffffffffff08))))))),
                                                  (SimpleString *)
                                                  CONCAT17(in_stack_ffffffffffffff07,
                                                           CONCAT16(in_stack_ffffffffffffff06,
                                                                    CONCAT15(
                                                  in_stack_ffffffffffffff05,
                                                  CONCAT14(in_stack_ffffffffffffff04,
                                                           CONCAT13(in_stack_ffffffffffffff03,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))));
                                    SimpleString::~SimpleString((SimpleString *)0x21c2ef);
                                    if ((in_stack_ffffffffffffff07 & 1) == 0) {
                                      SimpleString::SimpleString
                                                ((SimpleString *)
                                                 CONCAT17(in_stack_ffffffffffffff07,
                                                          CONCAT16(in_stack_ffffffffffffff06,
                                                                   CONCAT15(
                                                  in_stack_ffffffffffffff05,
                                                  CONCAT14(in_stack_ffffffffffffff04,
                                                           CONCAT13(in_stack_ffffffffffffff03,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))),
                                                 (char *)in_stack_fffffffffffffef8);
                                      in_stack_ffffffffffffff06 =
                                           SimpleString::startsWith
                                                     ((SimpleString *)
                                                      CONCAT17(in_stack_ffffffffffffff0f,
                                                               CONCAT16(in_stack_ffffffffffffff0e,
                                                                        CONCAT15(
                                                  in_stack_ffffffffffffff0d,
                                                  CONCAT14(in_stack_ffffffffffffff0c,
                                                           CONCAT13(in_stack_ffffffffffffff0b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff0a,
                                                  CONCAT11(in_stack_ffffffffffffff09,
                                                           in_stack_ffffffffffffff08))))))),
                                                  (SimpleString *)
                                                  CONCAT17(in_stack_ffffffffffffff07,
                                                           CONCAT16(in_stack_ffffffffffffff06,
                                                                    CONCAT15(
                                                  in_stack_ffffffffffffff05,
                                                  CONCAT14(in_stack_ffffffffffffff04,
                                                           CONCAT13(in_stack_ffffffffffffff03,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))));
                                      SimpleString::~SimpleString((SimpleString *)0x21c378);
                                      if ((in_stack_ffffffffffffff06 & 1) == 0) {
                                        SimpleString::SimpleString
                                                  ((SimpleString *)
                                                   CONCAT17(in_stack_ffffffffffffff07,
                                                            CONCAT16(in_stack_ffffffffffffff06,
                                                                     CONCAT15(
                                                  in_stack_ffffffffffffff05,
                                                  CONCAT14(in_stack_ffffffffffffff04,
                                                           CONCAT13(in_stack_ffffffffffffff03,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))),
                                                  (char *)in_stack_fffffffffffffef8);
                                        in_stack_ffffffffffffff04 =
                                             SimpleString::startsWith
                                                       ((SimpleString *)
                                                        CONCAT17(in_stack_ffffffffffffff0f,
                                                                 CONCAT16(in_stack_ffffffffffffff0e,
                                                                          CONCAT15(
                                                  in_stack_ffffffffffffff0d,
                                                  CONCAT14(in_stack_ffffffffffffff0c,
                                                           CONCAT13(in_stack_ffffffffffffff0b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff0a,
                                                  CONCAT11(in_stack_ffffffffffffff09,
                                                           in_stack_ffffffffffffff08))))))),
                                                  (SimpleString *)
                                                  CONCAT17(in_stack_ffffffffffffff07,
                                                           CONCAT16(in_stack_ffffffffffffff06,
                                                                    CONCAT15(
                                                  in_stack_ffffffffffffff05,
                                                  CONCAT14(in_stack_ffffffffffffff04,
                                                           CONCAT13(in_stack_ffffffffffffff03,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))));
                                        SimpleString::~SimpleString((SimpleString *)0x21c40b);
                                        if ((in_stack_ffffffffffffff04 & 1) == 0) {
                                          SimpleString::SimpleString
                                                    ((SimpleString *)
                                                     CONCAT17(in_stack_ffffffffffffff07,
                                                              CONCAT16(in_stack_ffffffffffffff06,
                                                                       CONCAT15(
                                                  in_stack_ffffffffffffff05,
                                                  CONCAT14(in_stack_ffffffffffffff04,
                                                           CONCAT13(in_stack_ffffffffffffff03,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))),
                                                  (char *)in_stack_fffffffffffffef8);
                                          in_stack_ffffffffffffff02 =
                                               SimpleString::startsWith
                                                         ((SimpleString *)
                                                          CONCAT17(in_stack_ffffffffffffff0f,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff0e,
                                                  CONCAT15(in_stack_ffffffffffffff0d,
                                                           CONCAT14(in_stack_ffffffffffffff0c,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff0b,
                                                  CONCAT12(in_stack_ffffffffffffff0a,
                                                           CONCAT11(in_stack_ffffffffffffff09,
                                                                    in_stack_ffffffffffffff08)))))))
                                                  ,(SimpleString *)
                                                   CONCAT17(in_stack_ffffffffffffff07,
                                                            CONCAT16(in_stack_ffffffffffffff06,
                                                                     CONCAT15(
                                                  in_stack_ffffffffffffff05,
                                                  CONCAT14(in_stack_ffffffffffffff04,
                                                           CONCAT13(in_stack_ffffffffffffff03,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff02,
                                                  in_stack_ffffffffffffff00)))))));
                                          SimpleString::~SimpleString((SimpleString *)0x21c4a9);
                                          if ((in_stack_ffffffffffffff02 & 1) == 0) {
                                            local_19 = false;
                                          }
                                          else {
                                            SetPackageName(in_stack_ffffffffffffff60,
                                                           in_stack_ffffffffffffff5c,
                                                           in_stack_ffffffffffffff50,
                                                           in_stack_ffffffffffffff48);
                                          }
                                        }
                                        else {
                                          in_stack_ffffffffffffff03 =
                                               (**(code **)(*in_RSI + 0x38))
                                                         (in_RSI,*(undefined4 *)(in_RDI + 8),
                                                          *(undefined8 *)(in_RDI + 0x10),local_20);
                                          local_19 = (bool)(in_stack_ffffffffffffff03 & 1);
                                        }
                                      }
                                      else {
                                        in_stack_ffffffffffffff05 =
                                             SetOutputType(in_stack_ffffffffffffff88,
                                                           in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff78,
                                                           in_stack_ffffffffffffff70);
                                        local_19 = (bool)in_stack_ffffffffffffff05;
                                      }
                                    }
                                    else {
                                      AddTestToRunBasedOnVerboseOutput
                                                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc
                                                 ,in_stack_ffffffffffffffb0,
                                                 in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
                                                );
                                    }
                                  }
                                  else {
                                    AddTestToRunBasedOnVerboseOutput
                                              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                                               in_stack_ffffffffffffffa0);
                                  }
                                }
                                else {
                                  AddExcludeStrictNameFilter
                                            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                                             in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
                                }
                              }
                              else {
                                AddExcludeNameFilter
                                          (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                                           in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
                              }
                            }
                            else {
                              AddStrictNameFilter(in_stack_ffffffffffffff60,
                                                  in_stack_ffffffffffffff5c,
                                                  in_stack_ffffffffffffff50,
                                                  in_stack_ffffffffffffff48);
                            }
                          }
                          else {
                            AddNameFilter(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                                          in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
                          }
                        }
                        else {
                          AddExcludeStrictGroupFilter
                                    (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                                     in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
                        }
                      }
                      else {
                        AddExcludeGroupFilter
                                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                                   in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
                      }
                    }
                    else {
                      AddStrictGroupFilter
                                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (local_19 == false) {
      local_1 = 0;
    }
    SimpleString::~SimpleString((SimpleString *)0x21c559);
    if (local_19 == false) goto LAB_0021c594;
  }
  local_1 = 1;
LAB_0021c594:
  return (bool)(local_1 & 1);
}

Assistant:

bool CommandLineArguments::parse(TestPlugin* plugin)
{
    bool correctParameters = true;
    for (int i = 1; i < ac_; i++) {
        SimpleString argument = av_[i];

        if      (argument == "-v") verbose_ = true;
        else if (argument == "-c") color_ = true;
        else if (argument == "-p") runTestsAsSeperateProcess_ = true;
        else if (argument == "-lg") listTestGroupNames_ = true;
        else if (argument == "-ln") listTestGroupAndCaseNames_ = true;
        else if (argument == "-ri") runIgnored_ = true;
        else if (argument.startsWith("-r")) SetRepeatCount(ac_, av_, i);
        else if (argument.startsWith("-g")) AddGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-sg")) AddStrictGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-xg")) AddExcludeGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-xsg")) AddExcludeStrictGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-n")) AddNameFilter(ac_, av_, i);
        else if (argument.startsWith("-sn")) AddStrictNameFilter(ac_, av_, i);
        else if (argument.startsWith("-xn")) AddExcludeNameFilter(ac_, av_, i);
        else if (argument.startsWith("-xsn")) AddExcludeStrictNameFilter(ac_, av_, i);
        else if (argument.startsWith("TEST(")) AddTestToRunBasedOnVerboseOutput(ac_, av_, i, "TEST(");
        else if (argument.startsWith("IGNORE_TEST(")) AddTestToRunBasedOnVerboseOutput(ac_, av_, i, "IGNORE_TEST(");
        else if (argument.startsWith("-o")) correctParameters = SetOutputType(ac_, av_, i);
        else if (argument.startsWith("-p")) correctParameters = plugin->parseAllArguments(ac_, av_, i);
        else if (argument.startsWith("-k")) SetPackageName(ac_, av_, i);
        else correctParameters = false;

        if (correctParameters == false) {
            return false;
        }
    }
    return true;
}